

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
testing::ScopedTrace::ScopedTrace(ScopedTrace *this,char *file,int line,char *message)

{
  char *local_78;
  allocator local_49;
  string local_48;
  char *local_28;
  char *message_local;
  char *pcStack_18;
  int line_local;
  char *file_local;
  ScopedTrace *this_local;
  
  local_78 = message;
  if (message == (char *)0x0) {
    local_78 = "(null)";
  }
  local_28 = message;
  message_local._4_4_ = line;
  pcStack_18 = file;
  file_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,local_78,&local_49);
  PushTrace(this,file,line,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

ScopedTrace(const char* file, int line, const char* message) {
    PushTrace(file, line, message ? message : "(null)");
  }